

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bqm.hpp
# Opt level: O3

void BQMTester<cimod::Dict>::test_DenseBQMFunctionTest_remove_interaction(void)

{
  const_iterator cVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  long *plVar5;
  BQM<std::string,_double,_cimod::Dict> bqm;
  double offset;
  Quadratic<std::string,_double> quadratic;
  Linear<std::string,_double> linear;
  AssertHelper local_170;
  undefined1 local_168 [8];
  AssertHelperData *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  unsigned_long local_128;
  undefined1 local_120 [32];
  _Alloc_hider local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [24];
  long *local_d0;
  long local_a8 [2];
  undefined8 local_98;
  double local_90;
  _Hashtable<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_50;
  
  local_120._0_8_ = local_120 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"c","");
  local_100._M_p = &DAT_4000000000000000;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::allocator<std::pair<std::__cxx11::string_const,double>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,double>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::allocator<std::pair<std::__cxx11::string_const,double>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_50,local_120,local_f8,0,&local_88,local_168,local_148);
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  local_168 = (undefined1  [8])0x1e86c1;
  local_160 = (AssertHelperData *)0x1e76d6;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_120,(pair<const_char_*,_const_char_*> *)local_168);
  local_e8._8_8_ = 0xbff0000000000000;
  local_148 = (undefined1  [8])0x1e76d6;
  local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e939d;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_e8 + 0x10),(pair<const_char_*,_const_char_*> *)local_148);
  local_98 = 0x3ff0000000000000;
  std::
  _Hashtable<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,double>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<std::__cxx11::string,std::__cxx11::string>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,double>const*>
            ((_Hashtable<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,double>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<std::__cxx11::string,std::__cxx11::string>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_88,local_120,&local_90,0,&local_90,&local_170,&local_128);
  lVar3 = -0x90;
  plVar5 = local_a8;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    if (plVar5 + -4 != (long *)plVar5[-6]) {
      operator_delete((long *)plVar5[-6],plVar5[-4] + 1);
    }
    plVar5 = plVar5 + -9;
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0);
  local_90 = 0.0;
  cimod::
  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
  ::BinaryQuadraticModel
            ((BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
              *)local_120,(Linear<std::__cxx11::basic_string<char>,_double> *)&local_50,
             (Quadratic<std::__cxx11::basic_string<char>,_double> *)&local_88,&local_90,SPIN);
  local_168 = (undefined1  [8])&local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"b","");
  local_148 = (undefined1  [8])&local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"c","");
  cimod::
  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
  ::remove_interaction
            ((BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
              *)local_120,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
  if (local_148 != (undefined1  [8])&local_138) {
    operator_delete((void *)local_148,local_138._M_allocated_capacity + 1);
  }
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
  }
  local_168 = (undefined1  [8])&local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"a","");
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_120,(key_type *)local_168);
  local_170.data_._0_1_ =
       cVar1.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
       ._M_cur != (__node_type *)0x0;
  local_128 = CONCAT71(local_128._1_7_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_148,"bqm.contains(\"a\")","true",(bool *)&local_170,
             (bool *)&local_128);
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
  }
  if (local_148[0] == (string)0x0) {
    testing::Message::Message((Message *)local_168);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x267,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_168 + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  local_168 = (undefined1  [8])&local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"b","");
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_120,(key_type *)local_168);
  local_170.data_._0_1_ =
       cVar1.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
       ._M_cur != (__node_type *)0x0;
  local_128 = CONCAT71(local_128._1_7_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_148,"bqm.contains(\"b\")","true",(bool *)&local_170,
             (bool *)&local_128);
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
  }
  if (local_148[0] == (string)0x0) {
    testing::Message::Message((Message *)local_168);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x268,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_168 + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  local_168 = (undefined1  [8])&local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"c","");
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_120,(key_type *)local_168);
  local_170.data_._0_1_ =
       cVar1.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
       ._M_cur != (__node_type *)0x0;
  local_128 = CONCAT71(local_128._1_7_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_148,"bqm.contains(\"c\")","true",(bool *)&local_170,
             (bool *)&local_128);
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
  }
  if (local_148[0] == (string)0x0) {
    testing::Message::Message((Message *)local_168);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x269,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_168 + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  cimod::
  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
  ::interaction_matrix
            ((Matrix *)local_168,
             (BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
              *)local_120);
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_168);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  free((void *)local_168);
  local_148 = (undefined1  [8])local_d0;
  local_170.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_168,"bqm.get_quadratic().size()","1",(unsigned_long *)local_148,
             (int *)&local_170);
  if (local_168[0] == (string)0x0) {
    testing::Message::Message((Message *)local_148);
    if (local_160 == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_160;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x26e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_148 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_148 + 8))();
    }
  }
  if (local_160 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
  }
  cimod::
  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
  ::interaction_matrix
            ((Matrix *)local_168,
             (BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
              *)local_120);
  local_170.data_ = local_160;
  local_128 = local_120._24_8_ + 1;
  testing::internal::CmpHelperEQ<long,unsigned_long>
            ((internal *)local_148,"bqm.interaction_matrix().rows()","bqm.get_num_variables() + 1",
             (long *)&local_170,&local_128);
  free((void *)local_168);
  if (local_148[0] == (string)0x0) {
    testing::Message::Message((Message *)local_168);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x270,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_168 + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  cimod::
  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
  ::interaction_matrix
            ((Matrix *)local_168,
             (BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
              *)local_120);
  local_170.data_ = (AssertHelperData *)local_158._M_allocated_capacity;
  local_128 = local_120._24_8_ + 1;
  testing::internal::CmpHelperEQ<long,unsigned_long>
            ((internal *)local_148,"bqm.interaction_matrix().cols()","bqm.get_num_variables() + 1",
             (long *)&local_170,&local_128);
  free((void *)local_168);
  if (local_148[0] == (string)0x0) {
    testing::Message::Message((Message *)local_168);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x271,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_168 + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  local_168 = (undefined1  [8])&local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"a","");
  local_148 = (undefined1  [8])&local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"b","");
  cimod::
  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
  ::remove_interaction
            ((BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
              *)local_120,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
  if (local_148 != (undefined1  [8])&local_138) {
    operator_delete((void *)local_148,local_138._M_allocated_capacity + 1);
  }
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
  }
  local_168 = (undefined1  [8])&local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"a","");
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_120,(key_type *)local_168);
  local_170.data_._0_1_ =
       cVar1.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
       ._M_cur != (__node_type *)0x0;
  local_128 = local_128 & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_148,"bqm.contains(\"a\")","false",(bool *)&local_170,
             (bool *)&local_128);
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
  }
  if (local_148[0] == (string)0x0) {
    testing::Message::Message((Message *)local_168);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x275,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_168 + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  local_168 = (undefined1  [8])&local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"b","");
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_120,(key_type *)local_168);
  local_170.data_._0_1_ =
       cVar1.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
       ._M_cur != (__node_type *)0x0;
  local_128 = local_128 & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_148,"bqm.contains(\"b\")","false",(bool *)&local_170,
             (bool *)&local_128);
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
  }
  if (local_148[0] == (string)0x0) {
    testing::Message::Message((Message *)local_168);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x276,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_168 + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  local_168 = (undefined1  [8])&local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"c","");
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_120,(key_type *)local_168);
  local_170.data_._0_1_ =
       cVar1.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
       ._M_cur != (__node_type *)0x0;
  local_128 = CONCAT71(local_128._1_7_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_148,"bqm.contains(\"c\")","true",(bool *)&local_170,
             (bool *)&local_128);
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
  }
  if (local_148[0] == (string)0x0) {
    testing::Message::Message((Message *)local_168);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x277,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_168 + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  local_148 = (undefined1  [8])local_d0;
  local_170.data_ = local_170.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_168,"bqm.get_quadratic().size()","0",(unsigned_long *)local_148,
             (int *)&local_170);
  if (local_168[0] == (string)0x0) {
    testing::Message::Message((Message *)local_148);
    if (local_160 == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_160;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x27b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_148 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_148 + 8))();
    }
  }
  if (local_160 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
  }
  cimod::
  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
  ::interaction_matrix
            ((Matrix *)local_168,
             (BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
              *)local_120);
  local_170.data_ = local_160;
  local_128 = local_120._24_8_ + 1;
  testing::internal::CmpHelperEQ<long,unsigned_long>
            ((internal *)local_148,"bqm.interaction_matrix().rows()","bqm.get_num_variables() + 1",
             (long *)&local_170,&local_128);
  free((void *)local_168);
  if (local_148[0] == (string)0x0) {
    testing::Message::Message((Message *)local_168);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x27d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_168 + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  cimod::
  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
  ::interaction_matrix
            ((Matrix *)local_168,
             (BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
              *)local_120);
  local_170.data_ = (AssertHelperData *)local_158._M_allocated_capacity;
  local_128 = local_120._24_8_ + 1;
  testing::internal::CmpHelperEQ<long,unsigned_long>
            ((internal *)local_148,"bqm.interaction_matrix().cols()","bqm.get_num_variables() + 1",
             (long *)&local_170,&local_128);
  free((void *)local_168);
  if (local_148[0] == (string)0x0) {
    testing::Message::Message((Message *)local_168);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x27e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_168 + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  std::
  _Hashtable<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_e8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_120);
  std::
  _Hashtable<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_88);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_50);
  return;
}

Assistant:

static void test_DenseConstructionTest_ConstructionMatrix2()
    {
        using Matrix = Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor>;
        Matrix m = Matrix::Zero(4,4);
        m(0,0) = 21;
        m(1,1) = 26;
        m(2,2) = 31;
        m(3,3) = 36;

        m(0,1) = 1;
        m(0,2) = 2;
        m(0,3) = 3;

        m(1,0) = 5;
        m(1,2) = 6;
        m(1,3) = 7;

        m(2,0) = 9;
        m(2,1) = 10;
        m(2,3) = 11;

        m(3,0) = 13;
        m(3,1) = 14;
        m(3,2) = 15;

        auto labels = std::vector<std::string>{"a", "b", "d", "e"};

        BQM<std::string, double, DataType> bqm(m, labels, 0.0, Vartype::SPIN);

        Matrix int_mat = bqm.interaction_matrix();
        EXPECT_DOUBLE_EQ(int_mat(0,0), 0);
        EXPECT_DOUBLE_EQ(int_mat(0,1), 6);
        EXPECT_DOUBLE_EQ(int_mat(0,2), 11);
        EXPECT_DOUBLE_EQ(int_mat(0,3), 16);
        EXPECT_DOUBLE_EQ(int_mat(0,4), 21);
        EXPECT_DOUBLE_EQ(int_mat(1,0), 0);
        EXPECT_DOUBLE_EQ(int_mat(1,1), 0);
        EXPECT_DOUBLE_EQ(int_mat(1,2), 16);
        EXPECT_DOUBLE_EQ(int_mat(1,3), 21);
        EXPECT_DOUBLE_EQ(int_mat(1,4), 26);
        EXPECT_DOUBLE_EQ(int_mat(2,0), 0);
        EXPECT_DOUBLE_EQ(int_mat(2,1), 0);
        EXPECT_DOUBLE_EQ(int_mat(2,2), 0);
        EXPECT_DOUBLE_EQ(int_mat(2,3), 26);
        EXPECT_DOUBLE_EQ(int_mat(2,4), 31);
        EXPECT_DOUBLE_EQ(int_mat(3,0), 0);
        EXPECT_DOUBLE_EQ(int_mat(3,1), 0);
        EXPECT_DOUBLE_EQ(int_mat(3,2), 0);
        EXPECT_DOUBLE_EQ(int_mat(3,3), 0);
        EXPECT_DOUBLE_EQ(int_mat(3,4), 36);
        EXPECT_DOUBLE_EQ(int_mat(4,0), 0);
        EXPECT_DOUBLE_EQ(int_mat(4,1), 0);
        EXPECT_DOUBLE_EQ(int_mat(4,2), 0);
        EXPECT_DOUBLE_EQ(int_mat(4,3), 0);
        EXPECT_DOUBLE_EQ(int_mat(4,4), 1);

        //check elements

        EXPECT_DOUBLE_EQ(bqm.get_quadratic("a", "b"), 6);
        EXPECT_DOUBLE_EQ(bqm.get_quadratic("a", "d"), 11);
        EXPECT_DOUBLE_EQ(bqm.get_quadratic("a", "e"), 16);
        EXPECT_DOUBLE_EQ(bqm.get_quadratic("b", "d"), 16);
        EXPECT_DOUBLE_EQ(bqm.get_quadratic("b", "e"), 21);
        EXPECT_DOUBLE_EQ(bqm.get_quadratic("d", "e"), 26);

        EXPECT_DOUBLE_EQ(bqm.get_linear("a"), 21);
        EXPECT_DOUBLE_EQ(bqm.get_linear("b"), 26);
        EXPECT_DOUBLE_EQ(bqm.get_linear("d"), 31);
        EXPECT_DOUBLE_EQ(bqm.get_linear("e"), 36);
    }